

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O0

void Bmc_PerformICheck(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fEmpty,int fVerbose)

{
  bool bVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  abctime aVar12;
  char *pcVar13;
  sat_solver *s;
  int *begin;
  int *piVar14;
  abctime aVar15;
  double dVar16;
  uint local_ac;
  int fChanges;
  abctime clkStart;
  int *pLits;
  uint local_68;
  int nLits;
  int nLitsUsed;
  int Lit;
  int status;
  int i;
  Vec_Int_t *vUsed;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pTemp;
  Gia_Man_t *pMiter;
  int local_20;
  int fUseOldCnf;
  int fVerbose_local;
  int fEmpty_local;
  int nTimeOut_local;
  int nFramesMax_local;
  Gia_Man_t *p_local;
  
  pMiter._4_4_ = 0;
  local_20 = fVerbose;
  fUseOldCnf = fEmpty;
  fVerbose_local = nTimeOut;
  fEmpty_local = nFramesMax;
  _nTimeOut_local = p;
  aVar12 = Abc_Clock();
  if (fEmpty_local < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xce,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  iVar3 = Gia_ManRegNum(_nTimeOut_local);
  if (iVar3 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xcf,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (local_20 != 0) {
    pcVar13 = Gia_ManName(_nTimeOut_local);
    uVar4 = Gia_ManAndNum(_nTimeOut_local);
    uVar5 = Gia_ManRegNum(_nTimeOut_local);
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",pcVar13,
           (ulong)uVar4,(ulong)uVar5);
  }
  pCnf = (Cnf_Dat_t *)Gia_ManDup(_nTimeOut_local);
  pTemp = Gia_ManMiter(_nTimeOut_local,(Gia_Man_t *)pCnf,0,1,1,0,0);
  Gia_ManStop((Gia_Man_t *)pCnf);
  iVar3 = Gia_ManPoNum(pTemp);
  iVar6 = Gia_ManPoNum(_nTimeOut_local);
  if (iVar3 != iVar6 * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xd9,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  iVar3 = Gia_ManRegNum(pTemp);
  iVar6 = Gia_ManRegNum(_nTimeOut_local);
  if (iVar3 != iVar6 * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xda,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (pMiter._4_4_ == 0) {
    pCnf = (Cnf_Dat_t *)pTemp;
    pTemp = Jf_ManDeriveCnf(pTemp,0);
    Gia_ManStop((Gia_Man_t *)pCnf);
    pSat = (sat_solver *)pTemp->pData;
    pTemp->pData = (void *)0x0;
  }
  else {
    pSat = (sat_solver *)Cnf_DeriveGiaRemapped(pTemp);
  }
  iVar3 = Gia_ManCoNum(_nTimeOut_local);
  vUsed = Vec_IntAlloc(iVar3);
  for (Lit = 0; iVar3 = Lit, iVar6 = Gia_ManRegNum(_nTimeOut_local), pVVar2 = vUsed, iVar3 < iVar6;
      Lit = Lit + 1) {
    iVar3 = Abc_Var2Lit(Lit,fUseOldCnf);
    Vec_IntPush(pVVar2,iVar3);
  }
  if (fUseOldCnf == 0) {
    local_ac = Vec_IntSize(vUsed);
  }
  else {
    local_ac = 0;
  }
  local_68 = local_ac;
  iVar3 = Vec_IntSize(vUsed);
  _status = Vec_IntAlloc(iVar3);
  while( true ) {
    bVar1 = false;
    s = Bmc_DeriveSolver(_nTimeOut_local,pTemp,(Cnf_Dat_t *)pSat,fEmpty_local,fVerbose_local,
                         local_20);
    vLits = (Vec_Int_t *)s;
    begin = Vec_IntArray(vUsed);
    piVar14 = Vec_IntArray(vUsed);
    iVar3 = Vec_IntSize(vUsed);
    nLitsUsed = sat_solver_solve(s,begin,piVar14 + iVar3,0,0,0,0);
    if (nLitsUsed == 0) {
      printf("Timeout reached after %d seconds.\n",(ulong)(uint)fVerbose_local);
      goto LAB_006f69f3;
    }
    if (nLitsUsed == 1) break;
    if (nLitsUsed != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                    ,0xfe,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
    }
    pLits._4_4_ = sat_solver_final((sat_solver *)vLits,(int **)&clkStart);
    pVVar2 = _status;
    iVar3 = Vec_IntSize(vUsed);
    Vec_IntFill(pVVar2,iVar3,0);
    for (Lit = 0; pVVar2 = _status, Lit < pLits._4_4_; Lit = Lit + 1) {
      iVar3 = Abc_Lit2Var(*(int *)(clkStart + (long)Lit * 4));
      Vec_IntWriteEntry(pVVar2,iVar3,1);
    }
    for (Lit = 0; iVar3 = Lit, iVar7 = Vec_IntSize(vUsed), iVar6 = fEmpty_local, iVar3 < iVar7;
        Lit = Lit + 1) {
      nLits = Vec_IntEntry(vUsed,Lit);
      iVar3 = Lit;
      iVar6 = Abc_Lit2Var(nLits);
      if (iVar3 != iVar6) {
        __assert_fail("i == Abc_Lit2Var(Lit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0x109,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
      }
      iVar3 = Abc_LitIsCompl(nLits);
      if ((iVar3 == 0) &&
         (iVar6 = Vec_IntEntry(_status,Lit), pVVar2 = vUsed, iVar3 = Lit, iVar6 == 0)) {
        iVar6 = Abc_LitNot(nLits);
        Vec_IntWriteEntry(pVVar2,iVar3,iVar6);
        local_68 = local_68 - 1;
        bVar1 = true;
      }
    }
    if (local_20 != 0) {
      iVar3 = fEmpty_local + 1;
      iVar7 = Gia_ManAndNum(pTemp);
      iVar8 = Gia_ManRegNum(_nTimeOut_local);
      iVar9 = Gia_ManCoNum(_nTimeOut_local);
      iVar10 = sat_solver_nvars((sat_solver *)vLits);
      uVar5 = sat_solver_nconflicts((sat_solver *)vLits);
      uVar4 = local_68;
      dVar16 = (double)(int)local_68;
      iVar11 = Gia_ManRegNum(_nTimeOut_local);
      printf("M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
             (dVar16 * 100.0) / (double)iVar11,(ulong)(uint)iVar6,(ulong)(uint)(iVar3 * iVar7),
             (ulong)(uint)(iVar8 + iVar9 + iVar10),(ulong)uVar5,(ulong)uVar4);
    }
    if (local_20 != 0) {
      aVar15 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar15 - aVar12);
    }
    sat_solver_delete((sat_solver *)vLits);
    if ((!bVar1) || (fUseOldCnf != 0)) goto LAB_006f69f3;
  }
  printf("The problem is satisfiable (the current set is not M-inductive).\n");
LAB_006f69f3:
  Cnf_DataFree((Cnf_Dat_t *)pSat);
  Gia_ManStop(pTemp);
  Vec_IntFree(vUsed);
  Vec_IntFree(_status);
  return;
}

Assistant:

void Bmc_PerformICheck( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fEmpty, int fVerbose )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits, * vUsed;
    int i, status, Lit;
    int nLitsUsed, nLits, * pLits;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p) );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        Gia_ManStop( pTemp );
        pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
    }

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, fEmpty) );

    // iteratively compute a minimal M-inductive set of next-state functions
    nLitsUsed = fEmpty ? 0 : Vec_IntSize(vLits);
    vUsed = Vec_IntAlloc( Vec_IntSize(vLits) );
    while ( 1 )
    {
        int fChanges = 0;
        // derive SAT solver        
        pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
//        sat_solver_bookmark( pSat );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "Timeout reached after %d seconds.\n", nTimeOut );
            break;
        }
        if ( status == l_True )
        {
            printf( "The problem is satisfiable (the current set is not M-inductive).\n" );
            break;
        }
        assert( status == l_False );
        // call analize_final
        nLits = sat_solver_final( pSat, &pLits );
        // mark used literals
        Vec_IntFill( vUsed, Vec_IntSize(vLits), 0 );
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vUsed, Abc_Lit2Var(pLits[i]), 1 );

        // check if there are any positive unused
        Vec_IntForEachEntry( vLits, Lit, i )
        {
            assert( i == Abc_Lit2Var(Lit) );
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Vec_IntEntry(vUsed, i) )
                continue;
            // positive literal became unused
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Lit) );
            nLitsUsed--;
            fChanges = 1;
        }
        // report the results
        if ( fVerbose )
        printf( "M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        // count the number of negative literals
        sat_solver_delete( pSat );
        if ( !fChanges || fEmpty )
            break;
//        break;
//        sat_solver_rollback( pSat );
    }
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vLits );
    Vec_IntFree( vUsed );
}